

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall
cppcms::json::value::load(value *this,char **begin,char *end,bool full,int *line_number)

{
  bool bVar1;
  undefined4 *in_R8;
  int err_line;
  int *in_stack_00000150;
  bool in_stack_0000015f;
  value *in_stack_00000160;
  char *in_stack_00000168;
  char **in_stack_00000170;
  undefined4 local_34;
  undefined1 local_1;
  
  bVar1 = anon_unknown_9::parse_stream
                    (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_0000015f,
                     in_stack_00000150);
  if (bVar1) {
    local_1 = true;
  }
  else {
    if (in_R8 != (undefined4 *)0x0) {
      *in_R8 = local_34;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool value::load(char const *&begin,char const *end,bool full,int *line_number)
	{
		int err_line;
		if(!parse_stream(begin,end,*this,full,err_line)) {
			if(line_number)
				*line_number=err_line;
			return false;
		}
		return true;

	}